

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O1

bool __thiscall
QGraphicsProxyWidget::eventFilter(QGraphicsProxyWidget *this,QObject *object,QEvent *event)

{
  ushort uVar1;
  QGraphicsProxyWidgetPrivate *this_00;
  Data *pDVar2;
  byte bVar3;
  undefined1 uVar4;
  QStyle *style;
  QObject *pQVar5;
  long in_FS_OFFSET;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsProxyWidgetPrivate **)(this + 0x18);
  pDVar2 = (this_00->widget).wp.d;
  if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
    pQVar5 = (QObject *)0x0;
  }
  else {
    pQVar5 = (this_00->widget).wp.value;
  }
  if (pQVar5 == object) {
    uVar1 = *(ushort *)(event + 8);
    if (uVar1 < 0x4c) {
      if (uVar1 - 0x11 < 2) {
        if ((*(ushort *)&this_00->field_0x244 & 0x30) == 0) {
          *(ushort *)&this_00->field_0x244 = *(ushort *)&this_00->field_0x244 | 0x20;
          QGraphicsItem::setVisible((QGraphicsItem *)(this + 0x10),*(short *)(event + 8) == 0x11);
          this_00->field_0x244 = this_00->field_0x244 & 0xcf;
        }
      }
      else {
        if (uVar1 == 0xd) {
          bVar3 = this_00->field_0x244 & 3;
        }
        else {
          if (uVar1 != 0xe) goto LAB_0060829e;
          bVar3 = this_00->field_0x244 & 0xc;
        }
        if (bVar3 == 0) {
          QGraphicsProxyWidgetPrivate::updateProxyGeometryFromWidget(this_00);
        }
      }
    }
    else if (uVar1 < 100) {
      if (uVar1 == 0x4c) {
        (**(code **)(*(long *)this + 0xa8))(this);
      }
      else if ((uVar1 == 0x62) && ((*(ushort *)&this_00->field_0x244 & 0xc0) == 0)) {
        *(ushort *)&this_00->field_0x244 = *(ushort *)&this_00->field_0x244 | 0x80;
        QGraphicsItem::setEnabled
                  ((QGraphicsItem *)(this + 0x10),
                   (*(byte *)(*(long *)((this_00->widget).wp.value + 0x20) + 8) & 1) == 0);
        this_00->field_0x244 = this_00->field_0x244 & 0x3f;
      }
    }
    else if (uVar1 == 100) {
      if ((*(ushort *)&this_00->field_0x244 & 0x300) == 0) {
        *(ushort *)&this_00->field_0x244 = *(ushort *)&this_00->field_0x244 | 0x200;
        style = QWidget::style((QWidget *)(this_00->widget).wp.value);
        QGraphicsWidget::setStyle((QGraphicsWidget *)this,style);
        this_00->field_0x245 = this_00->field_0x245 & 0xfc;
      }
    }
    else if ((uVar1 == 0xb8) && ((*(ushort *)&this_00->field_0x244 & 0x3000) == 0)) {
      *(ushort *)&this_00->field_0x244 = *(ushort *)&this_00->field_0x244 | 0x2000;
      QWidget::toolTip(&local_50,(QWidget *)(this_00->widget).wp.value);
      QGraphicsItem::setToolTip((QGraphicsItem *)(this + 0x10),&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      this_00->field_0x245 = this_00->field_0x245 & 0xcf;
    }
  }
LAB_0060829e:
  uVar4 = QObject::eventFilter((QObject *)this,(QEvent *)object);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)uVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QGraphicsProxyWidget::eventFilter(QObject *object, QEvent *event)
{
    Q_D(QGraphicsProxyWidget);

    if (object == d->widget) {
        switch (event->type()) {
        case QEvent::LayoutRequest:
            updateGeometry();
            break;
         case QEvent::Resize:
             // If the widget resizes itself, we resize the proxy too.
             // Prevent feed-back by checking the geometry change mode.
             if (!d->sizeChangeMode)
                 d->updateProxyGeometryFromWidget();
            break;
         case QEvent::Move:
             // If the widget moves itself, we move the proxy too.  Prevent
             // feed-back by checking the geometry change mode.
             if (!d->posChangeMode)
                 d->updateProxyGeometryFromWidget();
            break;
        case QEvent::Hide:
        case QEvent::Show:
            // If the widget toggles its visible state, the proxy will follow.
            if (!d->visibleChangeMode) {
                d->visibleChangeMode = QGraphicsProxyWidgetPrivate::WidgetToProxyMode;
                setVisible(event->type() == QEvent::Show);
                d->visibleChangeMode = QGraphicsProxyWidgetPrivate::NoMode;
            }
            break;
        case QEvent::EnabledChange:
            // If the widget toggles its enabled state, the proxy will follow.
            if (!d->enabledChangeMode) {
                d->enabledChangeMode = QGraphicsProxyWidgetPrivate::WidgetToProxyMode;
                setEnabled(d->widget->isEnabled());
                d->enabledChangeMode = QGraphicsProxyWidgetPrivate::NoMode;
            }
            break;
        case QEvent::StyleChange:
            // Propagate style changes to the proxy.
            if (!d->styleChangeMode) {
                d->styleChangeMode = QGraphicsProxyWidgetPrivate::WidgetToProxyMode;
                setStyle(d->widget->style());
                d->styleChangeMode = QGraphicsProxyWidgetPrivate::NoMode;
            }
            break;
#if QT_CONFIG(tooltip)
        case QEvent::ToolTipChange:
            // Propagate tooltip change to the proxy.
            if (!d->tooltipChangeMode) {
                d->tooltipChangeMode = QGraphicsProxyWidgetPrivate::WidgetToProxyMode;
                setToolTip(d->widget->toolTip());
                d->tooltipChangeMode = QGraphicsProxyWidgetPrivate::NoMode;
            }
            break;
#endif
        default:
            break;
        }
    }
    return QGraphicsWidget::eventFilter(object, event);
}